

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

void ebur128_check_true_peak(ebur128_state *st,size_t frames)

{
  interp_filter *piVar1;
  double *pdVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  ebur128_state_internal *peVar6;
  interpolator *piVar7;
  float *pfVar8;
  double *pdVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_t sVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  double dVar20;
  float *local_58;
  
  peVar6 = st->d;
  piVar7 = peVar6->interp;
  pfVar11 = peVar6->resampler_buffer_input;
  local_58 = peVar6->resampler_buffer_output;
  uVar4 = piVar7->factor;
  uVar5 = piVar7->channels;
  for (sVar16 = 0; sVar16 != frames; sVar16 = sVar16 + 1) {
    for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
      pfVar8 = piVar7->z[uVar19];
      uVar15 = piVar7->zi;
      pfVar8[uVar15] = *pfVar11;
      pfVar18 = local_58 + uVar19;
      for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
        piVar1 = piVar7->filter + uVar14;
        dVar20 = 0.0;
        for (uVar13 = 0; piVar1->count != uVar13; uVar13 = uVar13 + 1) {
          iVar17 = uVar15 - piVar7->filter[uVar14].index[uVar13];
          if (iVar17 < 0) {
            iVar17 = iVar17 + piVar7->delay;
          }
          dVar20 = dVar20 + (double)pfVar8[iVar17] * piVar1->coeff[uVar13];
        }
        *pfVar18 = (float)dVar20;
        pfVar18 = pfVar18 + uVar5;
      }
      pfVar11 = pfVar11 + 1;
    }
    local_58 = local_58 + uVar4 * uVar5;
    uVar15 = piVar7->zi + 1;
    if (uVar15 == piVar7->delay) {
      uVar15 = 0;
    }
    piVar7->zi = uVar15;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 != uVar4 * frames; lVar12 = lVar12 + 1) {
    uVar5 = st->channels;
    for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
      fVar3 = *(float *)((long)st->d->resampler_buffer_output + uVar19 * 4 + lVar10 * (ulong)uVar5);
      dVar20 = (double)fVar3;
      if (fVar3 <= 0.0) {
        dVar20 = -dVar20;
      }
      pdVar9 = st->d->prev_true_peak;
      pdVar2 = pdVar9 + uVar19;
      if (*pdVar2 <= dVar20 && dVar20 != *pdVar2) {
        pdVar9[uVar19] = dVar20;
      }
    }
    lVar10 = lVar10 + 4;
  }
  return;
}

Assistant:

static void ebur128_check_true_peak(ebur128_state* st, size_t frames) {
  size_t c, i, frames_out;

  frames_out =
      interp_process(st->d->interp, frames, st->d->resampler_buffer_input,
                     st->d->resampler_buffer_output);

  for (i = 0; i < frames_out; ++i) {
    for (c = 0; c < st->channels; ++c) {
      double val =
          (double) st->d->resampler_buffer_output[i * st->channels + c];

      if (EBUR128_MAX(val, -val) > st->d->prev_true_peak[c]) {
        st->d->prev_true_peak[c] = EBUR128_MAX(val, -val);
      }
    }
  }
}